

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverMaxPlus.h
# Opt level: O0

double __thiscall
BGIP_SolverMaxPlus<JointPolicyPureVector>::Solve(BGIP_SolverMaxPlus<JointPolicyPureVector> *this)

{
  bool bVar1;
  ofstream *poVar2;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *this_00;
  type pBVar3;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *pvVar4;
  BayesianGameIdenticalPayoffSolver *pBVar5;
  reference this_01;
  reference pvVar6;
  BayesianGameIdenticalPayoffSolver *in_RDI;
  Index bestAction;
  Index varIndex;
  Index tI;
  Index agI;
  JointPolicyPureVector jpolBG;
  shared_ptr<JointPolicyPureVector> temp;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *config;
  double value;
  MaxPlus mp;
  double tol;
  size_t verb;
  Properties props;
  FactorGraph fg;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> facs;
  bool debug;
  vector<libDAI::Var,_std::allocator<libDAI::Var>_> vars;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  var_indices;
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> bgip;
  BayesianGameIdenticalPayoffSolver *in_stack_fffffffffffffa18;
  double dVar7;
  BayesianGameBase *in_stack_fffffffffffffa20;
  PropertyKey *in_stack_fffffffffffffa28;
  JointPolicyPureVector *in_stack_fffffffffffffa30;
  shared_ptr<JointPolicyDiscretePure> *in_stack_fffffffffffffa38;
  type *in_stack_fffffffffffffa40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa48;
  shared_ptr<JointPolicyPureVector> *this_02;
  allocator<char> *in_stack_fffffffffffffa50;
  char *in_stack_fffffffffffffa58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_03;
  uint local_548;
  uint local_544;
  BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector> *in_stack_fffffffffffffb28;
  shared_ptr<JointPolicyPureVector> local_498;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_488;
  double local_480;
  MaxPlus local_478 [527];
  undefined1 local_269 [33];
  undefined8 local_248;
  allocator<char> local_231;
  string local_230 [47];
  allocator<char> local_201;
  string local_200 [47];
  allocator<char> local_1d1;
  string local_1d0 [32];
  long local_1b0;
  allocator<char> local_199;
  string local_198 [32];
  Properties local_178;
  FactorGraph local_148 [208];
  vector local_78 [47];
  byte local_49;
  vector local_48 [24];
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_30;
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> local_18;
  
  BayesianGameIdenticalPayoffSolver::GetBGIPI(in_stack_fffffffffffffa18);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)0x151cf6);
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::vector
            ((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)0x151d0b);
  local_49 = 7 < *(int *)(in_RDI + 0x130);
  MaxPlusSolverForBGs::Construct_AgentTypePair_Variables
            ((shared_ptr *)&local_18,(vector *)&local_30,local_48,(uint)local_49);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::vector
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)0x151d5d)
  ;
  MaxPlusSolverForBGs::Construct_JointType_Factors
            ((shared_ptr *)&local_18,(vector *)&local_30,local_48,local_78,local_49 & 1);
  libDAI::FactorGraph::FactorGraph(local_148,local_78);
  libDAI::Properties::Properties((Properties *)0x151db2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
  boost::any::any<unsigned_long&>
            ((any *)in_stack_fffffffffffffa50,(unsigned_long *)in_stack_fffffffffffffa48,
             in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
  libDAI::Properties::Set
            ((Properties *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,
             (PropertyValue *)in_stack_fffffffffffffa20);
  boost::any::~any((any *)in_stack_fffffffffffffa20);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator(&local_199);
  local_1b0 = (long)*(int *)(in_RDI + 0x130);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
  boost::any::any<unsigned_long&>
            ((any *)in_stack_fffffffffffffa50,(unsigned_long *)in_stack_fffffffffffffa48,
             in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
  libDAI::Properties::Set
            ((Properties *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,
             (PropertyValue *)in_stack_fffffffffffffa20);
  boost::any::~any((any *)in_stack_fffffffffffffa20);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
  boost::any::any<std::__cxx11::string&>
            ((any *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,
             in_stack_fffffffffffffa38);
  libDAI::Properties::Set
            ((Properties *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,
             (PropertyValue *)in_stack_fffffffffffffa20);
  boost::any::~any((any *)in_stack_fffffffffffffa20);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator(&local_201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
  boost::any::any<double&>
            ((any *)in_stack_fffffffffffffa50,(double *)in_stack_fffffffffffffa48,
             in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
  libDAI::Properties::Set
            ((Properties *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,
             (PropertyValue *)in_stack_fffffffffffffa20);
  boost::any::~any((any *)in_stack_fffffffffffffa20);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator(&local_231);
  local_248 = 0x3f1a36e2eb1c432d;
  this_03 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_269;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_03,in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
  boost::any::any<double&>
            ((any *)in_stack_fffffffffffffa50,(double *)in_stack_fffffffffffffa48,
             in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
  libDAI::Properties::Set
            ((Properties *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,
             (PropertyValue *)in_stack_fffffffffffffa20);
  boost::any::~any((any *)in_stack_fffffffffffffa20);
  std::__cxx11::string::~string((string *)(local_269 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_269);
  libDAI::MaxPlus::MaxPlus(local_478,local_148,&local_178,1);
  libDAI::MaxPlus::init();
  bVar1 = BayesianGameIdenticalPayoffSolver::GetWriteAnyTimeResults(in_RDI);
  if (bVar1) {
    poVar2 = BayesianGameIdenticalPayoffSolver::GetResultsOFStream(in_RDI);
    BayesianGameIdenticalPayoffSolver::GetTimingsOFStream(in_RDI);
    libDAI::MaxPlus::SetAnyTimeResults(SUB81(local_478,0),(ofstream *)0x1,poVar2);
  }
  local_480 = (double)libDAI::MaxPlus::run();
  local_488 = libDAI::MaxPlus::GetBestConfiguration(local_478);
  BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>::GetNewJpol(in_stack_fffffffffffffb28);
  this_02 = &local_498;
  boost::dynamic_pointer_cast<JointPolicyPureVector,JointPolicyDiscretePure>
            (in_stack_fffffffffffffa38);
  boost::shared_ptr<JointPolicyDiscretePure>::~shared_ptr
            ((shared_ptr<JointPolicyDiscretePure> *)0x15242f);
  boost::shared_ptr<JointPolicyPureVector>::operator*(this_02);
  JointPolicyPureVector::JointPolicyPureVector
            (in_stack_fffffffffffffa30,(JointPolicyPureVector *)in_stack_fffffffffffffa28);
  local_544 = 0;
  while( true ) {
    this_00 = (vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
              (ulong)local_544;
    pBVar3 = boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::operator->(&local_18);
    pvVar4 = (vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
             (**(code **)(*(long *)pBVar3 + 0x18))();
    if (pvVar4 <= this_00) break;
    local_548 = 0;
    while( true ) {
      in_stack_fffffffffffffa20 = (BayesianGameBase *)(ulong)local_548;
      boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::operator->(&local_18);
      pBVar5 = (BayesianGameIdenticalPayoffSolver *)
               BayesianGameBase::GetNrTypes
                         (in_stack_fffffffffffffa20,
                          (Index)((ulong)in_stack_fffffffffffffa18 >> 0x20));
      if (pBVar5 <= in_stack_fffffffffffffa20) break;
      this_01 = std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::operator[](&local_30,(ulong)local_544);
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (this_01,(ulong)local_548);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                (local_488,(ulong)*pvVar6);
      JointPolicyPureVector::SetAction
                ((JointPolicyPureVector *)in_stack_fffffffffffffa20,
                 (Index)((ulong)in_stack_fffffffffffffa18 >> 0x20),(Index)in_stack_fffffffffffffa18,
                 0);
      local_548 = local_548 + 1;
    }
    local_544 = local_544 + 1;
  }
  BayesianGameIdenticalPayoffSolver::AddSolution
            ((BayesianGameIdenticalPayoffSolver *)in_stack_fffffffffffffa20,
             (JointPolicyPureVector *)in_stack_fffffffffffffa18,6.84750775919321e-318);
  dVar7 = local_480;
  JointPolicyPureVector::~JointPolicyPureVector((JointPolicyPureVector *)in_stack_fffffffffffffa20);
  boost::shared_ptr<JointPolicyPureVector>::~shared_ptr
            ((shared_ptr<JointPolicyPureVector> *)0x152609);
  libDAI::MaxPlus::~MaxPlus((MaxPlus *)in_stack_fffffffffffffa20);
  libDAI::Properties::~Properties((Properties *)0x152623);
  libDAI::FactorGraph::~FactorGraph((FactorGraph *)in_stack_fffffffffffffa20);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::~vector(this_00);
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::~vector
            ((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)this_00);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)this_00);
  boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::~shared_ptr
            ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)0x152664);
  return dVar7;
}

Assistant:

double Solve()
        {
            boost::shared_ptr<const BayesianGameIdenticalPayoffInterface> bgip = 
                BayesianGameIdenticalPayoffSolver_T<JP>::GetBGIPI();

            //an assignment of variables (v3, v8, v14) corresponds to an assignment
            //of joint actions (a1, a2, a3) for a particular joint type.
            //I.e., each (the action taken for eah) (agent,type)-pair is a variable 
            //of the factor graph.
            //let's create these variables
    
            // var_indices[agI][tI] stores the (agent,type)-pair index atI
            std::vector< std::vector<Index> > var_indices;    
            // vars stores the variables. vars[atI]
            std::vector< libDAI::Var > vars;
            bool debug = (_m_verbosity > 7);
            Construct_AgentTypePair_Variables(bgip, var_indices, vars, debug);
            
            //each joint type corresponds to a factor... 
            //let's create them
            std::vector<libDAI::Factor> facs;
            Construct_JointType_Factors(bgip, var_indices, vars, facs, debug);

            //and finally you construct the FactorGraph from that:
            libDAI::FactorGraph fg(facs);

            //size_t  maxiter = 1000;
            //size_t  verb = 2;
            libDAI::Properties props;
            props.Set("maxiter",_m_maxiter);
            //libDAI expects verbosity to be a size_t and will actually crash!
            size_t verb = static_cast<size_t>(_m_verbosity);
            props.Set("verbose", verb);
            props.Set("updates",_m_updateType);
            props.Set("damping",_m_damping);
            double  tol = 1e-4;
            props.Set("tol",tol);
            libDAI::MaxPlus mp (fg, props);
            mp.init();
            if(BayesianGameIdenticalPayoffSolver_T<JP>::GetWriteAnyTimeResults())
                mp.SetAnyTimeResults(true,
                                     BayesianGameIdenticalPayoffSolver_T<JP>::GetResultsOFStream(),
                                     BayesianGameIdenticalPayoffSolver_T<JP>::GetTimingsOFStream());
            double value = mp.run();
            
            //Create the BG policy as computed by MaxPlus...
            
            const std::vector<size_t> & config = mp.GetBestConfiguration();
            // construct the JP with the bgip now
            //JP jpolBG( BayesianGameIdenticalPayoffSolver_T<JP>::_m_solution.GetJointPolicyPureVector() );
            boost::shared_ptr<JP> temp = 
                boost::dynamic_pointer_cast<JP>( BayesianGameIdenticalPayoffSolver_T<JP>::GetNewJpol() );
            JP jpolBG( *temp);
//            delete temp;
            for(Index agI = 0; agI < bgip->GetNrAgents(); agI++)
                for(Index tI = 0; tI < bgip->GetNrTypes(agI); tI++)
                {
                    Index varIndex = var_indices[agI][tI];
                    Index bestAction = config[varIndex];
                    jpolBG.SetAction(agI, tI, bestAction);
                }
            //store the solution
            BayesianGameIdenticalPayoffSolver_T<JP>::AddSolution(jpolBG, value);
            
            return(value);
        }